

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O3

bool __thiscall
road_network::in_between(road_network *this,node_type start,node_type stop,node_type q)

{
  node_type node;
  node_type *pnVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined7 in_register_00000009;
  char cVar5;
  deque<node_type,std::allocator<node_type>> *this_00;
  node_type *pnVar6;
  node_type n;
  vector<node_type,_std::allocator<node_type>_> vec;
  deque<node_type,_std::allocator<node_type>_> queue;
  node_type local_b2;
  node_type local_b1;
  uint local_b0;
  undefined4 local_ac;
  node_type *local_a8;
  node_type *local_a0;
  long local_98;
  road_network *local_90;
  _Deque_base<node_type,_std::allocator<node_type>_> local_88;
  
  uVar4 = (undefined4)CONCAT71(in_register_00000009,q);
  local_b1 = stop;
  local_90 = this;
  bVar2 = are_twins(this,start,q);
  if ((bVar2) || (bVar2 = are_twins(this,stop,q), bVar2)) {
    return false;
  }
  local_b0 = (uint)start;
  bVar2 = are_twins(this,start,stop);
  if (stop == q) {
    return true;
  }
  if (start == q) {
    return true;
  }
  if (bVar2) {
    return true;
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_M_initialize_map(&local_88,0);
  local_ac = uVar4;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
              ((deque<node_type,std::allocator<node_type>> *)&local_88,&local_b1);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = stop;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  do {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011fb45;
    node = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    bVar2 = true;
    if (node == (node_type)local_ac) goto LAB_0011fb48;
    this_00 = (deque<node_type,std::allocator<node_type>> *)&local_a8;
    get_predecessors((vector<node_type,_std::allocator<node_type>_> *)this_00,local_90,node);
    pnVar1 = local_a0;
    for (pnVar6 = local_a8; pnVar6 != pnVar1; pnVar6 = pnVar6 + 1) {
      local_b2 = *pnVar6;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        this_00 = (deque<node_type,std::allocator<node_type>> *)&local_88;
        std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
                  ((deque<node_type,std::allocator<node_type>> *)&local_88,&local_b2);
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_b2;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    }
    cVar5 = '\x03';
    if (*local_88._M_impl.super__Deque_impl_data._M_start._M_cur != start) {
      bVar3 = are_twins((road_network *)this_00,
                        *local_88._M_impl.super__Deque_impl_data._M_start._M_cur,(node_type)local_b0
                       );
      cVar5 = bVar3 * '\x03';
    }
    if (local_a8 != (node_type *)0x0) {
      operator_delete(local_a8,local_98 - (long)local_a8);
    }
  } while (cVar5 == '\0');
  if (cVar5 == '\x03') {
LAB_0011fb45:
    bVar2 = false;
  }
LAB_0011fb48:
  std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base(&local_88);
  return bVar2;
}

Assistant:

bool road_network::in_between(node_type start, node_type stop, node_type q)
{
    if(are_twins(start, q) || are_twins(stop, q))
    {
        return false;
    }

    if(are_twins(start, stop) || start == q || stop == q)
    {
        return true;
    }

    std::deque<node_type> queue;
    queue.push_back(stop);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        if (current == q)
        {
            return true;
        }

        std::vector<node_type> vec = get_predecessors(current);
        for(auto n : vec)
        {
            queue.push_back(n);
        }

        if (queue.front() == start || are_twins(queue.front(), start))
        {
            break;
        }
    }
    return false;
}